

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void mainloop(trans2p *t)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long in_RDI;
  ssize_t count;
  int res;
  handler *h;
  ev_event ev;
  ev_impl *impl;
  ev_api *api;
  int local_30 [2];
  long local_28;
  uint local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = in_RDI + 0x328;
  local_18 = *(undefined8 *)(in_RDI + 800);
  printf("mainloop\n");
  do {
    iVar2 = (**(code **)(local_10 + 0x20))(local_18,0,local_30);
    lVar1 = local_28;
    if (0 < iVar2) {
      if ((local_20 & 1) != 0) {
        do {
          sVar3 = read(local_30[0],(void *)(lVar1 + 8),0x800);
          if ((sVar3 < 1) || (*(long *)(lVar1 + 0x808) == 0)) {
            if (sVar3 == 0) {
              close(local_30[0]);
              (**(code **)(local_10 + 0x18))(local_18);
            }
            else {
              piVar4 = __errno_location();
              if (*piVar4 != 0xb) {
                perror("read");
              }
            }
          }
          else {
            (**(code **)(lVar1 + 0x808))(sVar3);
          }
        } while (0 < sVar3);
      }
      tick((trans2p *)0x11464d);
      if (((local_20 & 2) != 0) && (*(long *)(lVar1 + 0x810) != 0)) {
        (**(code **)(lVar1 + 0x810))(lVar1);
      }
    }
  } while (iVar2 != -1);
  return;
}

Assistant:

void mainloop(struct trans2p * t)
{
  struct ev_api * api = &t->api;
  struct ev_impl * impl = t->impl;
  struct ev_event ev;
  struct handler * h;
  int res;
  ssize_t count;
  printf("mainloop\n");
  do
  {
    res = api->poll(impl, 0, &ev);
    if(res > 0)
    {
      h = (struct handler *) ev.ptr;
      if(ev.flags & EV_READ)
      {
        do
        {
          count = read(ev.fd, h->readbuf, sizeof(h->readbuf));
          if(count > 0 && h->read)
          {
            h->read(count, h);
          }
          else if (count == 0)
          {
            // connection closed
            close(ev.fd);
            api->del(impl, ev.fd);
          }
          else if (errno != EAGAIN)
          {
            perror("read");
          }
        }
        while(count > 0);     
      }
      tick(t);
      if (ev.flags & EV_WRITE)
      {
        if(h->write)
          h->write(h);
      }
    }
  }
  while(res != -1);
}